

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBox.h
# Opt level: O0

bool __thiscall adios2::kvcache::QueryBox::operator==(QueryBox *this,QueryBox *box)

{
  int iVar1;
  char *__s1;
  char *__s2;
  QueryBox *in_stack_00000038;
  string local_50 [32];
  string local_30 [48];
  
  toString_abi_cxx11_(in_stack_00000038);
  __s1 = (char *)std::__cxx11::string::c_str();
  toString_abi_cxx11_(in_stack_00000038);
  __s2 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(__s1,__s2);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return iVar1 == 0;
}

Assistant:

bool operator==(const QueryBox &box) const
    {
        return std::strcmp(toString().c_str(), box.toString().c_str()) == 0;
    }